

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

StartLayout valid_layout_start(Env *env,Lexed next)

{
  bool bVar1;
  Symbol i;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar2 = 2;
  do {
    if (env->symbols[uVar2] != false) {
      if ((env->state->contexts).size == 0) goto LAB_0010a5ef;
      lVar4 = 0;
      switch((int)uVar2) {
      case 3:
        lVar4 = 1;
        break;
      case 4:
        lVar4 = 2;
        break;
      case 5:
        lVar4 = 5;
        bVar1 = true;
        goto LAB_0010a5ca;
      case 6:
        lVar4 = 3;
        break;
      case 7:
        lVar4 = 4;
      }
      bVar1 = false;
LAB_0010a5ca:
      if (next != LBar) {
        if (next == LBraceOpen) {
          if ((env->state->newline).state - NInit < 2) {
LAB_0010a5ef:
            uVar3 = 0x900000000;
            goto LAB_0010a5ff;
          }
          lVar4 = 6;
          uVar2 = 8;
        }
        else if (bVar1) goto LAB_0010a5ef;
      }
      uVar3 = lVar4 << 0x20;
      goto LAB_0010a5ff;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 9);
  uVar3 = 0x900000000;
  uVar2 = 0;
LAB_0010a5ff:
  return (StartLayout)(uVar2 & 0xffffffff | uVar3);
}

Assistant:

static StartLayout valid_layout_start(Env *env, Lexed next) {
  StartLayout start = {.sym = valid_layout_start_sym(env), .sort = NoContext};
  if (uninitialized(env) || start.sym == FAIL) return start;
  ContextSort sort = layout_sort(start.sym);
  switch (next) {
    case LBar:
      break;
    case LBraceOpen:
      if (newline_active(env)) return start;
      sort = Braces;
      start.sym = START_EXPLICIT;
      break;
    default:
      if (sort == MultiWayIfLayout) return start;
      break;
  }
  start.sort = sort;
  return start;
}